

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O2

void __thiscall
glslang::TParseContext::declareArray
          (TParseContext *this,TSourceLoc *loc,TString *identifier,TType *type,TSymbol **symbol)

{
  TSymbolTable *pTVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  undefined8 in_RAX;
  undefined4 extraout_var;
  TSymbol *pTVar5;
  undefined4 extraout_var_00;
  TVariable *this_01;
  undefined4 extraout_var_01;
  pointer pcVar6;
  char *pcVar7;
  TString *s;
  TParseContext *this_02;
  _func_int **pp_Var8;
  bool currentScope;
  TType *this_00;
  
  currentScope = SUB81((ulong)in_RAX >> 0x38,0);
  pTVar5 = *symbol;
  if (pTVar5 == (TSymbol *)0x0) {
    this_02 = (TParseContext *)(this->super_TParseContextBase).symbolTable;
    s = identifier;
    pTVar5 = TSymbolTable::find((TSymbolTable *)this_02,identifier,(bool *)0x0,&currentScope,
                                (int *)0x0);
    *symbol = pTVar5;
    if (pTVar5 != (TSymbol *)0x0) {
      s = identifier;
      bVar2 = builtInName(this_02,identifier);
      if ((bVar2) &&
         (pTVar1 = (this->super_TParseContextBase).symbolTable,
         3 < (int)((ulong)((long)(pTVar1->table).
                                 super__Vector_base<glslang::TSymbolTableLevel_*,_std::allocator<glslang::TSymbolTableLevel_*>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(pTVar1->table).
                                super__Vector_base<glslang::TSymbolTableLevel_*,_std::allocator<glslang::TSymbolTableLevel_*>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 3))) {
LAB_003a49a7:
        *symbol = (TSymbol *)0x0;
        return;
      }
      if ((*symbol != (TSymbol *)0x0) && (currentScope != false)) {
        iVar3 = (*(*symbol)->_vptr_TSymbol[0xb])();
        if (CONCAT44(extraout_var_00,iVar3) != 0) {
          (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                    (this,loc,"cannot redeclare a user-block member array",
                     (identifier->_M_dataplus)._M_p,"");
          goto LAB_003a49a7;
        }
        pTVar5 = *symbol;
        if (pTVar5 != (TSymbol *)0x0) goto LAB_003a487b;
        pcVar6 = (identifier->_M_dataplus)._M_p;
        pp_Var8 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
        pcVar7 = "array variable name expected";
        goto LAB_003a4a9b;
      }
    }
    this_01 = (TVariable *)TSymbol::operator_new((TSymbol *)0xf8,(size_t)s);
    TVariable::TVariable(this_01,identifier,type,false);
    *symbol = (TSymbol *)this_01;
    TSymbolTable::insert((this->super_TParseContextBase).symbolTable,(TSymbol *)this_01);
    pTVar1 = (this->super_TParseContextBase).symbolTable;
    if (((int)((ulong)((long)(pTVar1->table).
                             super__Vector_base<glslang::TSymbolTableLevel_*,_std::allocator<glslang::TSymbolTableLevel_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(pTVar1->table).
                            super__Vector_base<glslang::TSymbolTableLevel_*,_std::allocator<glslang::TSymbolTableLevel_*>_>
                            ._M_impl.super__Vector_impl_data._M_start) >> 3) < 5) &&
       ((*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x4d])
                  (this,*symbol), pTVar1 = (this->super_TParseContextBase).symbolTable,
       (int)((ulong)((long)(pTVar1->table).
                           super__Vector_base<glslang::TSymbolTableLevel_*,_std::allocator<glslang::TSymbolTableLevel_*>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(pTVar1->table).
                          super__Vector_base<glslang::TSymbolTableLevel_*,_std::allocator<glslang::TSymbolTableLevel_*>_>
                          ._M_impl.super__Vector_impl_data._M_start) >> 3) < 4)) {
      return;
    }
    bVar2 = isIoResizeArray(this,type);
    if (!bVar2) {
      iVar3 = (*(*symbol)->_vptr_TSymbol[0xd])();
      fixIoArraySize(this,loc,(TType *)CONCAT44(extraout_var_01,iVar3));
      return;
    }
    std::vector<glslang::TSymbol_*,_glslang::pool_allocator<glslang::TSymbol_*>_>::push_back
              (&(this->ioArraySymbolResizeList).
                super_vector<glslang::TSymbol_*,_glslang::pool_allocator<glslang::TSymbol_*>_>,
               symbol);
    bVar2 = true;
LAB_003a4a5a:
    checkIoArraysConsistency(this,loc,bVar2);
  }
  else {
LAB_003a487b:
    iVar3 = (*pTVar5->_vptr_TSymbol[0xd])();
    this_00 = (TType *)CONCAT44(extraout_var,iVar3);
    iVar3 = (*this_00->_vptr_TType[0x1d])(this_00);
    if ((char)iVar3 == '\0') {
      pcVar6 = (identifier->_M_dataplus)._M_p;
      pp_Var8 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
      pcVar7 = "redeclaring non-array as array";
    }
    else {
      bVar2 = TType::sameElementType(this_00,type,(int *)0x0,(int *)0x0);
      if (bVar2) {
        bVar2 = TType::sameInnerArrayness(this_00,type);
        if (bVar2) {
          iVar3 = (*this_00->_vptr_TType[0x1e])(this_00);
          if ((char)iVar3 == '\0') {
            iVar3 = (*type->_vptr_TType[0xf])(type);
            arrayLimitCheck(this,loc,identifier,iVar3);
            TType::updateArraySizes(this_00,type);
            bVar2 = isIoResizeArray(this,type);
            if (!bVar2) {
              return;
            }
            bVar2 = false;
            goto LAB_003a4a5a;
          }
          bVar2 = isIoResizeArray(this,type);
          if (bVar2) {
            iVar3 = (*this_00->_vptr_TType[0xf])(this_00);
            iVar4 = (*type->_vptr_TType[0xf])(type);
            if (iVar3 == iVar4) {
              return;
            }
          }
          pcVar6 = (identifier->_M_dataplus)._M_p;
          pp_Var8 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
          pcVar7 = "redeclaration of array with size";
        }
        else {
          pcVar6 = (identifier->_M_dataplus)._M_p;
          pp_Var8 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
          pcVar7 = "redeclaration of array with a different array dimensions or sizes";
        }
      }
      else {
        pcVar6 = (identifier->_M_dataplus)._M_p;
        pp_Var8 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
        pcVar7 = "redeclaration of array with a different element type";
      }
    }
LAB_003a4a9b:
    (*pp_Var8[0x2d])(this,loc,pcVar7,pcVar6,"");
  }
  return;
}

Assistant:

void TParseContext::declareArray(const TSourceLoc& loc, const TString& identifier, const TType& type, TSymbol*& symbol)
{
    if (symbol == nullptr) {
        bool currentScope;
        symbol = symbolTable.find(identifier, nullptr, &currentScope);

        if (symbol && builtInName(identifier) && ! symbolTable.atBuiltInLevel()) {
            // bad shader (errors already reported) trying to redeclare a built-in name as an array
            symbol = nullptr;
            return;
        }
        if (symbol == nullptr || ! currentScope) {
            //
            // Successfully process a new definition.
            // (Redeclarations have to take place at the same scope; otherwise they are hiding declarations)
            //
            symbol = new TVariable(&identifier, type);
            symbolTable.insert(*symbol);
            if (symbolTable.atGlobalLevel())
                trackLinkage(*symbol);

            if (! symbolTable.atBuiltInLevel()) {
                if (isIoResizeArray(type)) {
                    ioArraySymbolResizeList.push_back(symbol);
                    checkIoArraysConsistency(loc, true);
                } else
                    fixIoArraySize(loc, symbol->getWritableType());
            }

            return;
        }
        if (symbol->getAsAnonMember()) {
            error(loc, "cannot redeclare a user-block member array", identifier.c_str(), "");
            symbol = nullptr;
            return;
        }
    }

    //
    // Process a redeclaration.
    //

    if (symbol == nullptr) {
        error(loc, "array variable name expected", identifier.c_str(), "");
        return;
    }

    // redeclareBuiltinVariable() should have already done the copyUp()
    TType& existingType = symbol->getWritableType();

    if (! existingType.isArray()) {
        error(loc, "redeclaring non-array as array", identifier.c_str(), "");
        return;
    }

    if (! existingType.sameElementType(type)) {
        error(loc, "redeclaration of array with a different element type", identifier.c_str(), "");
        return;
    }

    if (! existingType.sameInnerArrayness(type)) {
        error(loc, "redeclaration of array with a different array dimensions or sizes", identifier.c_str(), "");
        return;
    }

    if (existingType.isSizedArray()) {
        // be more leniant for input arrays to geometry shaders and tessellation control outputs, where the redeclaration is the same size
        if (! (isIoResizeArray(type) && existingType.getOuterArraySize() == type.getOuterArraySize()))
            error(loc, "redeclaration of array with size", identifier.c_str(), "");
        return;
    }

    arrayLimitCheck(loc, identifier, type.getOuterArraySize());

    existingType.updateArraySizes(type);

    if (isIoResizeArray(type))
        checkIoArraysConsistency(loc);
}